

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_info.hpp
# Opt level: O0

string * __thiscall duckdb::CreateInfo::ToString_abi_cxx11_(CreateInfo *this)

{
  undefined8 uVar1;
  NotImplementedException *in_RSI;
  ParseInfoType in_stack_ffffffffffffffaf;
  allocator local_31;
  string local_30 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  
  uVar1 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"ToString not supported for this type of CreateInfo: \'%s\'",&local_31);
  EnumUtil::ToString<duckdb::ParseInfoType>(in_stack_ffffffffffffffaf);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  __cxa_throw(uVar1,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

virtual string ToString() const {
		throw NotImplementedException("ToString not supported for this type of CreateInfo: '%s'",
		                              EnumUtil::ToString(info_type));
	}